

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O0

strong_ordering compareThreeWay(QModelIndex *lhs,QModelIndex *rhs)

{
  long lVar1;
  totally_ordered_wrapper<const_QAbstractItemModel_*> lhs_00;
  bool bVar2;
  undefined8 in_RSI;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_RDI;
  long in_FS_OFFSET;
  strong_ordering val;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  strong_ordering o;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  CompareUnderlyingType local_9;
  
  o.m_order = (CompareUnderlyingType)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = (CompareUnderlyingType)
            Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffb8,0);
  bVar2 = Qt::is_eq(o);
  if (bVar2) {
    local_9 = (CompareUnderlyingType)
              Qt::compareThreeWay<int,_int,_true,_true>(in_stack_ffffffffffffffb8,0);
    bVar2 = Qt::is_eq(o);
    if (bVar2) {
      local_9 = (CompareUnderlyingType)
                Qt::compareThreeWay<unsigned_long_long,_unsigned_long_long,_true,_true>
                          (CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar2 = Qt::is_eq(o);
      if (bVar2) {
        lhs_00.ptr._7_1_ = in_stack_ffffffffffffffdf;
        lhs_00.ptr._0_7_ = in_stack_ffffffffffffffd8;
        local_9 = (CompareUnderlyingType)
                  Qt::compareThreeWay<const_QAbstractItemModel,_const_QAbstractItemModel,_true>
                            (lhs_00,in_RDI);
        bVar2 = Qt::is_eq(o);
        if (bVar2) {
          local_9 = '\0';
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (strong_ordering)local_9;
}

Assistant:

constexpr Qt::strong_ordering compareThreeWay(const QModelIndex &lhs, const QModelIndex &rhs) noexcept
    {
        if (auto val = Qt::compareThreeWay(lhs.r, rhs.r); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.c, rhs.c); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.i, rhs.i); !is_eq(val))
            return val;
        if (auto val = Qt::compareThreeWay(lhs.m, rhs.m); !is_eq(val))
            return val;
        return Qt::strong_ordering::equivalent;
    }